

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::formatReconstructedExpression(ostream *os,string *lhs,StringRef *op,string *rhs)

{
  long lVar1;
  ostream *poVar2;
  size_type sVar3;
  char *pcVar4;
  
  sVar3 = lhs->_M_string_length;
  pcVar4 = "\n";
  if (rhs->_M_string_length + sVar3 < 0x28) {
    lVar1 = std::__cxx11::string::find((char)lhs,10);
    if (lVar1 == -1) {
      lVar1 = std::__cxx11::string::find((char)rhs,10);
      sVar3 = lhs->_M_string_length;
      pcVar4 = "\n";
      if (lVar1 == -1) {
        pcVar4 = " ";
      }
    }
    else {
      sVar3 = lhs->_M_string_length;
    }
  }
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)os,(lhs->_M_dataplus)._M_p,sVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,1);
  poVar2 = (ostream *)std::ostream::write((char *)poVar2,(long)op->m_start);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(rhs->_M_dataplus)._M_p,rhs->_M_string_length);
  return;
}

Assistant:

void formatReconstructedExpression( std::ostream &os, std::string const& lhs, StringRef op, std::string const& rhs ) {
        if( lhs.size() + rhs.size() < 40 &&
                lhs.find('\n') == std::string::npos &&
                rhs.find('\n') == std::string::npos )
            os << lhs << " " << op << " " << rhs;
        else
            os << lhs << "\n" << op << "\n" << rhs;
    }